

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdadeltaTrainer::update(AdadeltaTrainer *this,real scale)

{
  real rVar1;
  scalar_constant_op<float> sVar2;
  pointer pSVar3;
  pointer pSVar4;
  float *pfVar5;
  pointer pSVar6;
  float *pfVar7;
  float *pfVar8;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar9;
  bool bVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  byte bVar15;
  byte bVar16;
  pointer pSVar17;
  DstEvaluatorType *pDVar18;
  assign_op<float,_float> *paVar19;
  Parameters *this_00;
  uint uVar20;
  Model *pMVar21;
  pointer ppLVar22;
  ulong uVar23;
  char *__function;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  Index dstRows;
  AdadeltaTrainer *pAVar27;
  _Hash_node_base *p_Var28;
  Index index_3;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  Index index;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  eVar33;
  Parameters *pPVar34;
  Index index_1;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  Index dstRows_3;
  float *pfVar38;
  Index dstRows_2;
  uint uVar39;
  Index dstRows_1;
  ushort uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  int iVar78;
  int iVar79;
  real rVar80;
  undefined1 auVar81 [64];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> local_2e9;
  AdadeltaTrainer *local_2e8;
  real local_2e0;
  real local_2dc;
  generic_dense_assignment_kernel<_ad2e0912_> local_2d8;
  ulong local_2b8;
  ulong local_2b0;
  pointer local_2a8;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_2a0;
  undefined1 local_298 [16];
  pointer local_280;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_278;
  _Hash_node_base *local_270;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_268;
  Parameters *local_260;
  float *local_258;
  float *local_250;
  DstEvaluatorType local_240;
  undefined1 local_228 [16];
  pointer local_210;
  undefined1 local_208 [52];
  float fStack_1d4;
  ulong local_1c8;
  float *local_1b0;
  scalar_constant_op<float> local_1a4;
  ulong local_1a0;
  float *local_198;
  variable_if_dynamic<long,__1> local_188;
  float *local_180;
  float *local_170;
  real local_168;
  variable_if_dynamic<long,__1> local_160;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
  local_158;
  Parameters *local_148;
  float *local_140;
  variable_if_dynamic<long,__1> local_130;
  scalar_constant_op<float> local_128;
  scalar_constant_op<float> local_104;
  float *local_f8;
  variable_if_dynamic<long,__1> local_e8;
  float *local_d0;
  variable_if_dynamic<long,__1> local_c0;
  scalar_constant_op<float> local_b8;
  float *local_a0;
  variable_if_dynamic<long,__1> local_90;
  scalar_constant_op<float> local_88;
  undefined1 local_78 [64];
  
  local_2b8 = CONCAT44(local_2b8._4_4_,scale);
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8,
               (this->super_Trainer).model);
    pSVar3 = (this->hg).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hg).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    pSVar6 = (this->hg).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hg).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar6,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_208._16_4_ = SUB84(pSVar3,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_208);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8,(this->super_Trainer).model);
    pSVar4 = (this->hlg).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hlg).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->hlg).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hlg).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar17,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_208._16_4_ = SUB84(pSVar4,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_208);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8);
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8,
               (this->super_Trainer).model);
    pSVar3 = (this->hd).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hd).
         super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>._M_impl.
         super__Vector_impl_data._M_start;
    pSVar6 = (this->hd).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hd).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar6,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar6 >> 0x20);
    local_208._16_4_ = SUB84(pSVar3,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar3 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)local_208);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_2d8);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8,(this->super_Trainer).model);
    pSVar4 = (this->hld).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_2d8.m_functor._4_4_,local_2d8.m_functor._0_4_);
    local_208._0_8_ =
         (this->hld).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pSVar17 = (this->hld).
              super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_2d8.m_dst._4_4_,local_2d8.m_dst._0_4_);
    (this->hld).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_2d8.m_src._4_4_,local_2d8.m_src._0_4_);
    local_2d8.m_dst._0_4_ = 0.0;
    local_2d8.m_functor._0_4_ = 0;
    local_2d8.m_functor._4_4_ = 0;
    local_2d8.m_dst._4_4_ = 0;
    local_2d8.m_src._0_4_ = 0;
    local_2d8.m_src._4_4_ = 0;
    local_208._8_4_ = SUB84(pSVar17,0);
    local_208._12_4_ = (undefined4)((ulong)pSVar17 >> 0x20);
    local_208._16_4_ = SUB84(pSVar4,0);
    local_208._20_4_ = (undefined4)((ulong)pSVar4 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               local_208);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_2d8);
    this->shadow_params_allocated = true;
  }
  local_280._0_4_ = Trainer::clip_gradients(&this->super_Trainer);
  pMVar21 = (this->super_Trainer).model;
  local_278 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
               )(pMVar21->params).
                super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
  eVar33 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
            )(pMVar21->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2e8 = this;
  if (eVar33 != local_278) {
    fVar11 = local_280._0_4_ * (float)local_2b8;
    auVar81 = ZEXT464((uint)fVar11);
    auVar43 = vbroadcasti64x4_avx512f(_DAT_0027dd00);
    auVar44 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    p_Var28 = (_Hash_node_base *)0x0;
    local_78 = vmovdqu64_avx512f(auVar43);
    local_298 = ZEXT416((uint)fVar11);
    local_2a8 = (pointer)CONCAT44(local_2a8._4_4_,fVar11 * fVar11);
    pDVar18 = local_2d8.m_dst;
    paVar19 = local_2d8.m_functor;
    do {
      auVar12 = local_228;
      local_2d8.m_functor._4_4_ = (undefined4)((ulong)paVar19 >> 0x20);
      local_2d8.m_dst._4_4_ = (undefined4)((ulong)pDVar18 >> 0x20);
      pPVar34 = *(Parameters **)eVar33;
      iVar79 = 1;
      iVar78 = 1;
      uVar23 = (ulong)(pPVar34->g).d.nd;
      if (uVar23 != 0) {
        auVar43 = vmovdqa64_avx512f(auVar44);
        auVar47 = vpbroadcastq_avx512f();
        uVar24 = 0;
        do {
          auVar48 = vpbroadcastq_avx512f();
          auVar49 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar48,auVar45);
          auVar48 = vporq_avx512f(auVar48,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar48,auVar47,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar47,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar48 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pPVar34->g).d.d + uVar24));
          auVar43._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar48._4_4_;
          auVar43._0_4_ = (uint)(bVar15 & 1) * auVar48._0_4_;
          auVar43._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar48._8_4_;
          auVar43._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar48._12_4_;
          auVar43._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar48._16_4_;
          auVar43._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar48._20_4_;
          auVar43._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar48._24_4_;
          auVar43._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar48._28_4_;
          auVar43._32_4_ = (uint)(bVar16 & 1) * auVar48._32_4_;
          auVar43._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar48._36_4_;
          auVar43._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar48._40_4_;
          auVar43._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar48._44_4_;
          auVar43._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar48._48_4_;
          auVar43._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar48._52_4_;
          auVar43._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar48._56_4_;
          auVar43._60_4_ = (uint)(bVar16 >> 7) * auVar48._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar43 = vpmulld_avx512f(auVar43,auVar49);
        } while ((uVar23 + 0xf & 0x1fffffff0) != uVar24);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar47._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar49._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar47._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar49._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar47._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar49._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar47._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar49._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar47._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar49._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar47._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar49._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar47._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar49._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar47._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar49._28_4_;
        auVar47._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar49._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar47._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar49._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar47._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar49._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar47._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar49._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar47._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar49._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar47._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar49._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar47._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar49._56_4_;
        auVar47._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar49._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar47,1);
        auVar43 = vpmulld_avx512f(auVar47,ZEXT3264(auVar42));
        auVar41 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar13 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar13);
        auVar13 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar13);
        iVar78 = auVar41._0_4_;
      }
      uVar23 = (ulong)(pPVar34->values).d.nd;
      if (uVar23 != 0) {
        auVar43 = vmovdqa64_avx512f(auVar44);
        auVar47 = vpbroadcastq_avx512f();
        uVar24 = 0;
        do {
          auVar48 = vpbroadcastq_avx512f();
          auVar49 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar48,auVar45);
          auVar48 = vporq_avx512f(auVar48,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar48,auVar47,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar47,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar34->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar24 * 4));
          auVar48._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar48._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar48._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar48._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar48._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar48._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar48._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar48._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar48._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar48._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar48._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar48._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar48._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar48._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar48._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar48._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar43 = vpmulld_avx512f(auVar48,auVar49);
        } while ((uVar23 + 0xf & 0x1fffffff0) != uVar24);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar50._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar49._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar49._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar49._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar49._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar49._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar49._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar49._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar50._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar49._28_4_;
        auVar50._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar49._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar50._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar49._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar50._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar49._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar50._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar49._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar50._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar49._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar50._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar49._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar50._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar49._56_4_;
        auVar50._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar49._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar50,1);
        auVar43 = vpmulld_avx512f(auVar50,ZEXT3264(auVar42));
        auVar41 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar13 = vpshufd_avx(auVar41,0xee);
        auVar41 = vpmulld_avx(auVar41,auVar13);
        auVar13 = vpshufd_avx(auVar41,0x55);
        auVar41 = vpmulld_avx(auVar41,auVar13);
        iVar79 = auVar41._0_4_;
      }
      local_228._4_4_ = 0;
      local_228._0_4_ = iVar79 * (pPVar34->values).d.bd;
      uVar26 = iVar78 * (pPVar34->g).d.bd;
      uVar23 = (ulong)uVar26;
      local_2a0 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                   )(pPVar34->values).v;
      pfVar5 = (pPVar34->g).v;
      pSVar3 = (local_2e8->hg).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      rVar1 = (local_2e8->super_Trainer).lambda;
      pSVar6 = (local_2e8->hd).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_228._8_8_ = auVar12._8_8_;
      pfVar7 = pSVar3[(long)p_Var28].h.v;
      uVar24 = (ulong)pSVar3[(long)p_Var28].h.d.nd;
      local_270 = p_Var28;
      local_268 = eVar33;
      local_260 = pPVar34;
      if (uVar24 == 0) {
        uVar20 = pSVar3[(long)p_Var28].h.d.bd;
        if (uVar20 != uVar26) goto LAB_0022b497;
        rVar80 = local_2e8->rho;
LAB_0022a03c:
        iVar78 = 1;
      }
      else {
        auVar43 = vmovdqa64_avx512f(auVar44);
        uVar35 = uVar24 + 0xf & 0x1fffffff0;
        auVar47 = vpbroadcastq_avx512f();
        uVar29 = 0;
        do {
          auVar48 = vpbroadcastq_avx512f();
          auVar49 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar48,auVar45);
          auVar48 = vporq_avx512f(auVar48,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar48,auVar47,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar47,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)p_Var28].h.d.d + uVar29 * 4));
          auVar51._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar51._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar51._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar51._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar51._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar51._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar51._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar51._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar51._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar51._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar51._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar51._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar51._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar51._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar51._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar51._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar43 = vpmulld_avx512f(auVar51,auVar49);
        } while (uVar35 != uVar29);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar52._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar49._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar49._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar49._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar49._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar49._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar49._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar49._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar52._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar49._28_4_;
        auVar52._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar49._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar52._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar49._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar52._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar49._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar52._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar49._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar52._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar49._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar52._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar49._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar52._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar49._56_4_;
        auVar52._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar49._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar52,1);
        uVar20 = pSVar3[(long)p_Var28].h.d.bd;
        auVar43 = vpmulld_avx512f(auVar52,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        if (auVar12._0_4_ * uVar20 != uVar26) goto LAB_0022b497;
        rVar80 = local_2e8->rho;
        if (uVar24 == 0) goto LAB_0022a03c;
        uVar24 = 0;
        auVar43 = vmovdqa64_avx512f(auVar44);
        do {
          auVar48 = vpbroadcastq_avx512f();
          auVar49 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar48,auVar45);
          auVar48 = vporq_avx512f(auVar48,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar48,auVar47,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar47,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)p_Var28].h.d.d + uVar24 * 4));
          auVar53._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar53._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar53._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar53._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar53._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar53._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar53._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar53._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar53._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar53._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar53._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar53._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar53._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar53._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar53._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar53._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar43 = vpmulld_avx512f(auVar53,auVar49);
        } while (uVar35 != uVar24);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar54._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar49._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar49._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar49._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar49._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar49._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar49._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar49._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar54._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar49._28_4_;
        auVar54._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar49._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar54._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar49._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar54._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar49._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar54._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar49._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar54._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar49._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar54._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar49._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar54._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar49._56_4_;
        auVar54._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar49._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar54,1);
        auVar43 = vpmulld_avx512f(auVar54,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        iVar78 = auVar12._0_4_;
      }
      local_208._0_4_ = rVar80;
      local_2d8.m_dst._0_4_ = auVar81._0_4_;
      local_208._12_4_ = SUB84(pfVar7,0);
      local_208._16_4_ = (undefined4)((ulong)pfVar7 >> 0x20);
      local_2d8.m_src._4_4_ = SUB84(pfVar5,0);
      local_2d8.m_functor._0_4_ = (undefined4)((ulong)pfVar5 >> 0x20);
      if (uVar20 * iVar78 != uVar26) {
LAB_0022b425:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                     );
      }
      uVar24 = uVar23;
      if ((((ulong)pfVar7 & 3) == 0) &&
         (uVar24 = (ulong)(-((uint)((ulong)pfVar7 >> 2) & 0x3fffffff) & 0xf), uVar23 <= uVar24)) {
        uVar24 = uVar23;
      }
      auVar43 = vmovdqu64_avx512f(local_78);
      fVar11 = 1.0 - rVar80;
      uVar35 = uVar23 - uVar24;
      uVar29 = uVar35 + 0xf;
      if (-1 < (long)uVar35) {
        uVar29 = uVar35;
      }
      auVar43 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(local_2d8.m_dst._0_4_,
                                                               CONCAT48(local_2d8.m_dst._0_4_,
                                                                        CONCAT44(local_2d8.m_dst.
                                                                                 _0_4_,local_2d8.
                                                                                       m_dst._0_4_))
                                                              ),ZEXT416((uint)fVar11))),auVar43,
                                 ZEXT864(pfVar5));
      auVar81 = valignd_avx512f(auVar43,auVar43,9);
      if (uVar24 != 0) {
        lVar36 = 0;
        do {
          auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * local_2a8._0_4_ *
                                                  *(float *)(auVar81._0_8_ + lVar36 * 4))),
                                    ZEXT416((uint)(rVar80 * pfVar7[lVar36])),
                                    ZEXT416((uint)pfVar5[lVar36]));
          pfVar7[lVar36] = auVar12._0_4_;
          lVar36 = lVar36 + 1;
        } while (uVar24 != lVar36);
      }
      lVar36 = uVar24 + (uVar29 & 0xfffffffffffffff0);
      if (0xf < (long)uVar35) {
        auVar47 = vpmovsxbd_avx512f(_DAT_0027dce0);
        auVar43 = vpermt2d_avx512f(auVar43,auVar47,ZEXT464(uVar26));
        auVar47 = vbroadcastss_avx512f(ZEXT416((uint)rVar80));
        auVar41 = vextracti32x4_avx512f(auVar43,2);
        lVar25 = vpextrq_avx(auVar41,1);
        auVar12 = vpshufd_avx(auVar43._16_16_,0xee);
        auVar43 = vbroadcastss_avx512f
                            (ZEXT416((uint)(auVar12._0_4_ * auVar43._0_4_ * local_2d8.m_dst._0_4_)))
        ;
        do {
          auVar48 = vmulps_avx512f(auVar47,*(undefined1 (*) [64])(pfVar7 + uVar24));
          auVar49 = vmulps_avx512f(auVar43,*(undefined1 (*) [64])
                                            ((lVar25 << 0x20 | auVar41._0_8_ >> 0x20) + uVar24 * 4))
          ;
          auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,*(undefined1 (*) [64])(pfVar5 + uVar24));
          *(undefined1 (*) [64])(pfVar7 + uVar24) = auVar48;
          uVar24 = uVar24 + 0x10;
        } while ((long)uVar24 < lVar36);
      }
      if (lVar36 < (long)uVar23) {
        do {
          auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * local_2a8._0_4_ *
                                                  *(float *)(auVar81._0_8_ + lVar36 * 4))),
                                    ZEXT416((uint)(rVar80 * pfVar7[lVar36])),
                                    ZEXT416((uint)pfVar5[lVar36]));
          pfVar7[lVar36] = auVar12._0_4_;
          lVar36 = lVar36 + 1;
        } while (uVar23 != lVar36);
      }
      pfVar7 = pSVar6[(long)p_Var28].h.v;
      uVar24 = (ulong)pSVar6[(long)p_Var28].h.d.nd;
      if (uVar24 == 0) {
        iVar78 = 1;
      }
      else {
        uVar29 = 0;
        auVar43 = vmovdqa64_avx512f(auVar44);
        auVar81 = vpbroadcastq_avx512f();
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar47,auVar45);
          auVar47 = vporq_avx512f(auVar47,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)p_Var28].h.d.d + uVar29 * 4));
          auVar49._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar49._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar49._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar49._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar49._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar49._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar49._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar49._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar49._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar49._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar49._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar49._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar49._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar49._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar49._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar49._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar43 = vpmulld_avx512f(auVar49,auVar48);
        } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar81._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar81._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar81._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar81._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar81._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar81._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar81._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar81._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar81._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar81._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar81._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar81._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar81._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar81._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar81._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar81._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar81,1);
        auVar43 = vpmulld_avx512f(auVar81,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        iVar78 = auVar12._0_4_;
      }
      uVar20 = pSVar6[(long)p_Var28].h.d.bd;
      uVar29 = (ulong)(iVar78 * uVar20);
      if (uVar26 - iVar78 * uVar20 != 0) goto LAB_0022b469;
      uVar35 = (ulong)pSVar3[(long)p_Var28].h.d.nd;
      if (uVar35 == 0) {
        iVar78 = 1;
      }
      else {
        auVar43 = vmovdqa64_avx512f(auVar44);
        auVar81 = vpbroadcastq_avx512f();
        uVar37 = 0;
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar47,auVar45);
          auVar47 = vporq_avx512f(auVar47,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar3[(long)p_Var28].h.d.d + uVar37 * 4));
          auVar55._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar55._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar55._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar55._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar55._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar55._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar55._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar55._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar55._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar55._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar55._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar55._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar55._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar55._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar55._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar55._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar37 = uVar37 + 0x10;
          auVar43 = vpmulld_avx512f(auVar55,auVar48);
        } while ((uVar35 + 0xf & 0x1fffffff0) != uVar37);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar56._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar56._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar56._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar56._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar56._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar56._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar56._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar56._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar56._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar56._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar56,1);
        auVar43 = vpmulld_avx512f(auVar56,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        iVar78 = auVar12._0_4_;
      }
      uVar39 = iVar78 * pSVar3[(long)p_Var28].h.d.bd;
      pfVar38 = (float *)(ulong)uVar39;
      if (uVar26 - uVar39 != 0) goto LAB_0022b4c5;
      pfVar8 = pSVar3[(long)p_Var28].h.v;
      sVar2.m_other = local_2e8->epsilon;
      if (uVar24 == 0) {
        if (uVar20 != uVar26) goto LAB_0022b480;
        local_208._12_4_ = local_2e8->rho;
        uVar39 = uVar20;
LAB_0022a495:
        iVar78 = 1;
      }
      else {
        uVar35 = 0;
        auVar43 = vmovdqa64_avx512f(auVar44);
        uVar37 = uVar24 + 0xf & 0x1fffffff0;
        auVar81 = vpbroadcastq_avx512f();
        do {
          auVar47 = vpbroadcastq_avx512f();
          auVar48 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar47,auVar45);
          auVar47 = vporq_avx512f(auVar47,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)p_Var28].h.d.d + uVar35 * 4));
          auVar57._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar57._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar57._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar57._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar57._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar57._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar57._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar57._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar57._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar57._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar57._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar57._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar57._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar57._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar57._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar57._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar35 = uVar35 + 0x10;
          auVar43 = vpmulld_avx512f(auVar57,auVar48);
        } while (uVar37 != uVar35);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar58._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar58._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
        auVar58._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar58._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar58._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar58._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar58._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar58._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar58._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
        auVar58._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar58,1);
        auVar43 = vpmulld_avx512f(auVar58,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        uVar39 = auVar12._0_4_ * uVar20;
        if (uVar39 != uVar26) goto LAB_0022b480;
        local_208._12_4_ = local_2e8->rho;
        if (uVar24 == 0) goto LAB_0022a495;
        uVar24 = 0;
        auVar43 = vmovdqa64_avx512f(auVar44);
        do {
          auVar44 = vpbroadcastq_avx512f();
          auVar47 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar44,auVar45);
          auVar44 = vporq_avx512f(auVar44,auVar46);
          uVar14 = vpcmpuq_avx512f(auVar44,auVar81,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar6[(long)p_Var28].h.d.d + uVar24 * 4));
          auVar44._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar44._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar44._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar44._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar44._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar44._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar44._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar44._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar44._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar44._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar24 = uVar24 + 0x10;
          auVar43 = vpmulld_avx512f(auVar44,auVar47);
        } while (uVar37 != uVar24);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar45._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar47._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar47._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar47._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar47._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar47._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar47._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar45._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar47._28_4_;
        auVar45._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar45._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar47._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar45._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar47._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar45._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar47._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar45._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar47._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar45._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar47._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar45._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar47._56_4_;
        auVar45._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar45,1);
        auVar43 = vpmulld_avx512f(auVar45,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        iVar78 = auVar12._0_4_;
      }
      local_250 = (float *)(ulong)(uVar20 * iVar78);
      local_208._40_8_ = ZEXT48(uVar39);
      stack0xfffffffffffffe28 = (float *)CONCAT44(1.0 - (float)local_208._12_4_,local_208._48_4_);
      local_158.m_functor.m_other = sVar2.m_other;
      local_2e0 = sVar2.m_other;
      local_2dc = rVar1;
      local_2b0 = uVar29;
      local_258 = pfVar7;
      local_208._24_8_ = pfVar7;
      local_1a4.m_other = local_2d8.m_dst._0_4_;
      local_198 = pfVar5;
      local_188.m_value = uVar23;
      local_170 = pfVar7;
      local_160.m_value = uVar29;
      local_140 = pfVar8;
      local_130.m_value = (long)pfVar38;
      local_128.m_other = sVar2.m_other;
      local_104.m_other = local_2d8.m_dst._0_4_;
      local_f8 = pfVar5;
      local_e8.m_value = uVar23;
      local_d0 = pfVar7;
      local_c0.m_value = uVar29;
      local_b8.m_other = sVar2.m_other;
      local_a0 = pfVar8;
      local_90.m_value = (long)pfVar38;
      local_88.m_other = sVar2.m_other;
      if (uVar20 * iVar78 != uVar26) goto LAB_0022b425;
      local_2d8.m_src = (SrcEvaluatorType *)local_208;
      local_2d8.m_functor = &local_2e9;
      local_2d8.m_dstExpr = (DstXprType *)&local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_data = pfVar7;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)pfVar38;
      local_2d8.m_dst = &local_240;
      Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_2d8);
      this_00 = local_260;
      if (uVar26 != local_228._0_4_) goto LAB_0022b4ae;
      auVar43 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar24 = (ulong)(local_260->values).d.nd;
      if (uVar24 == 0) {
        iVar78 = 1;
      }
      else {
        auVar46 = vpbroadcastq_avx512f();
        uVar29 = 0;
        do {
          auVar81 = vpbroadcastq_avx512f();
          auVar47 = vmovdqa64_avx512f(auVar43);
          auVar43 = vporq_avx512f(auVar81,auVar44);
          auVar81 = vporq_avx512f(auVar81,auVar45);
          uVar14 = vpcmpuq_avx512f(auVar81,auVar46,2);
          bVar15 = (byte)uVar14;
          uVar14 = vpcmpuq_avx512f(auVar43,auVar46,2);
          bVar16 = (byte)uVar14;
          uVar40 = CONCAT11(bVar16,bVar15);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)&(((_Vector_impl *)(pPVar34->values).d.d)->
                                               super__Vector_impl_data)._M_start + uVar29 * 4));
          auVar59._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
          auVar59._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
          auVar59._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
          auVar59._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
          auVar59._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
          auVar59._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
          auVar59._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
          auVar59._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
          auVar59._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
          auVar59._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
          auVar59._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
          auVar59._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
          auVar59._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
          auVar59._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
          auVar59._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
          auVar59._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
          uVar29 = uVar29 + 0x10;
          auVar43 = vpmulld_avx512f(auVar59,auVar47);
        } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
        auVar43 = vmovdqa32_avx512f(auVar43);
        auVar46._0_4_ =
             (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
        bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
        auVar46._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar47._4_4_;
        bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
        auVar46._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar47._8_4_;
        bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
        auVar46._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar47._12_4_;
        bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
        auVar46._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar47._16_4_;
        bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
        auVar46._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar47._20_4_;
        bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
        auVar46._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar47._24_4_;
        bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
        auVar46._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar47._28_4_;
        auVar46._32_4_ =
             (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
        bVar10 = (bool)(bVar16 >> 1 & 1);
        auVar46._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar47._36_4_;
        bVar10 = (bool)(bVar16 >> 2 & 1);
        auVar46._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar47._40_4_;
        bVar10 = (bool)(bVar16 >> 3 & 1);
        auVar46._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar47._44_4_;
        bVar10 = (bool)(bVar16 >> 4 & 1);
        auVar46._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar47._48_4_;
        bVar10 = (bool)(bVar16 >> 5 & 1);
        auVar46._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar47._52_4_;
        bVar10 = (bool)(bVar16 >> 6 & 1);
        auVar46._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar47._56_4_;
        auVar46._60_4_ =
             (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
        auVar42 = vextracti64x4_avx512f(auVar46,1);
        auVar43 = vpmulld_avx512f(auVar46,ZEXT3264(auVar42));
        auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
        auVar41 = vpshufd_avx(auVar12,0xee);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        auVar41 = vpshufd_avx(auVar12,0x55);
        auVar12 = vpmulld_avx(auVar12,auVar41);
        iVar78 = auVar12._0_4_;
      }
      uVar20 = iVar78 * (local_260->values).d.bd;
      local_250 = (float *)(ulong)uVar20;
      local_258 = (local_260->values).v;
      local_208._36_4_ = local_298._0_4_;
      local_1a0 = local_2b0;
      local_198 = (float *)CONCAT44(local_198._4_4_,local_2e0);
      local_168 = local_2e0;
      local_158 = local_2a0;
      local_148 = (Parameters *)local_228._0_8_;
      local_140 = (float *)CONCAT44(local_140._4_4_,local_2dc);
      unique0x10002fcb = pfVar5;
      local_1c8 = uVar23;
      local_1b0 = pfVar7;
      local_180 = pfVar8;
      local_170 = pfVar38;
      if (uVar20 != uVar26) {
LAB_0022b447:
        local_168 = local_2e0;
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_2d8.m_dst = &local_240;
      local_2d8.m_src = (SrcEvaluatorType *)local_208;
      local_2d8.m_functor = &local_2e9;
      local_2d8.m_dstExpr = (DstXprType *)&local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_data = local_258;
      local_240.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)local_250;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
             *)&local_2d8);
      Parameters::clear(this_00);
      auVar81 = ZEXT1664(local_298);
      auVar44 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar46 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      p_Var28 = (_Hash_node_base *)(ulong)((int)local_270 + 1);
      eVar33 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                )((long)local_268 + 8);
      pDVar18 = local_2d8.m_dst;
      paVar19 = local_2d8.m_functor;
    } while (eVar33 != local_278);
    pMVar21 = (local_2e8->super_Trainer).model;
  }
  ppLVar22 = (pMVar21->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_210 = (pMVar21->lookup_params).
              super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pAVar27 = local_2e8;
  if (ppLVar22 != local_210) {
    local_280._0_4_ = local_280._0_4_ * (float)local_2b8;
    auVar43 = vbroadcasti64x4_avx512f(_DAT_0027dd00);
    auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    local_2b8 = 0;
    local_78 = vmovdqu64_avx512f(auVar43);
    local_228 = ZEXT416((uint)local_280._0_4_);
    local_2b0 = CONCAT44(local_2b0._4_4_,local_280._0_4_ * local_280._0_4_);
    do {
      p_Var28 = ((*ppLVar22)->non_zero_grads)._M_h._M_before_begin._M_nxt;
      local_298._0_8_ = *ppLVar22;
      local_280 = ppLVar22;
      if (p_Var28 != (_Hash_node_base *)0x0) {
        local_278 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                     )((pAVar27->hlg).
                       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_2b8);
        local_2a8 = (pAVar27->hld).
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_2b8;
        pDVar18 = local_2d8.m_dst;
        paVar19 = local_2d8.m_functor;
        do {
          local_2d8.m_functor._4_4_ = (undefined4)((ulong)paVar19 >> 0x20);
          local_2d8.m_dst._4_4_ = (undefined4)((ulong)pDVar18 >> 0x20);
          uVar23 = (ulong)*(uint *)&p_Var28[1]._M_nxt;
          iVar78 = 1;
          iVar79 = 1;
          lVar36 = *(long *)(local_298._0_8_ + 0x48);
          lVar25 = uVar23 * 0x48;
          uVar24 = (ulong)*(uint *)(lVar36 + 0x1c + lVar25);
          if (uVar24 != 0) {
            auVar43 = vmovdqa64_avx512f(auVar46);
            auVar81 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar36 + lVar25 + uVar29 * 4));
              auVar60._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar60._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar60._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar60._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar60._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar60._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar60._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar60._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar60._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar60._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar29 = uVar29 + 0x10;
              auVar43 = vpmulld_avx512f(auVar60,auVar48);
            } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar61._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar61._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar61._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar61._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar61._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar61._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar61._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar61._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar61._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar61._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar61._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar61._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar61._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar61._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar61._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar61._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar61,1);
            auVar43 = vpmulld_avx512f(auVar61,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar79 = auVar12._0_4_;
          }
          eVar33 = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                    )(uVar23 * 9);
          lVar31 = *(long *)(local_298._0_8_ + 0x30) + uVar23 * 0x48;
          if ((ulong)*(uint *)(lVar31 + 0x1c) != 0) {
            auVar43 = vmovdqa64_avx512f(auVar46);
            auVar81 = vpbroadcastq_avx512f();
            uVar24 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar31 + uVar24 * 4));
              auVar62._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar62._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar62._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar62._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar62._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar62._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar62._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar62._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar62._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar62._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar62._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar62._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar62._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar62._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar62._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar62._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar43 = vpmulld_avx512f(auVar62,auVar48);
            } while (((ulong)*(uint *)(lVar31 + 0x1c) + 0xf & 0x1fffffff0) != uVar24);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar63._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar63._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar63._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar63._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar63._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar63._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar63._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar63._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar63._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar63._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar63._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar63._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar63._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar63._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar63._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar63._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar63,1);
            auVar43 = vpmulld_avx512f(auVar63,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          rVar1 = (pAVar27->super_Trainer).lambda;
          uVar26 = iVar79 * *(int *)(lVar36 + lVar25 + 0x20);
          uVar35 = (ulong)uVar26;
          pPVar34 = (Parameters *)(ulong)(uint)(iVar78 * *(int *)(lVar31 + 0x20));
          pfVar5 = *(float **)(lVar36 + 0x28 + lVar25);
          eVar9 = *(evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>
                    *)(*(long *)(local_298._0_8_ + 0x30) + 0x28 + uVar23 * 0x48);
          lVar36 = *(long *)local_278;
          uVar29 = (ulong)*(uint *)(lVar36 + 0x1c + uVar23 * 0x48);
          lVar25 = *(long *)&(local_2a8->h).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   lVar25;
          uVar24 = *(ulong *)(lVar36 + 0x70 + (uVar23 - 1) * 0x48);
          if (uVar29 == 0) {
            uVar20 = *(uint *)(lVar36 + 0x68 + (uVar23 - 1) * 0x48);
            if (uVar20 != uVar26) goto LAB_0022b497;
            rVar80 = pAVar27->rho;
LAB_0022abe0:
            iVar78 = 1;
          }
          else {
            auVar43 = vmovdqa64_avx512f(auVar46);
            uVar30 = uVar29 + 0xf & 0x1fffffff0;
            auVar81 = vpbroadcastq_avx512f();
            uVar37 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar36 + 8 + uVar23 * 0x48 + (uVar37 - 2) * 4));
              auVar64._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar64._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar64._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar64._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar64._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar64._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar64._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar64._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar64._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar64._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar64._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar64._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar64._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar64._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar64._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar64._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar37 = uVar37 + 0x10;
              auVar43 = vpmulld_avx512f(auVar64,auVar48);
            } while (uVar30 != uVar37);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar65._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar65._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar65._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar65._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar65._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar65._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar65._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar65._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar65._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar65._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar65._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar65._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar65._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar65._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar65._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar65._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar65,1);
            uVar20 = *(uint *)(lVar36 + 0x68 + (uVar23 - 1) * 0x48);
            auVar43 = vpmulld_avx512f(auVar65,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            if (auVar12._0_4_ * uVar20 != uVar26) goto LAB_0022b497;
            rVar80 = pAVar27->rho;
            if (uVar29 == 0) goto LAB_0022abe0;
            uVar29 = 0;
            auVar43 = vmovdqa64_avx512f(auVar46);
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar36 + 8 + uVar23 * 0x48 + (uVar29 - 2) * 4));
              auVar66._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar66._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar66._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar66._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar66._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar66._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar66._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar66._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar66._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar66._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar66._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar66._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar66._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar66._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar66._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar66._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar29 = uVar29 + 0x10;
              auVar43 = vpmulld_avx512f(auVar66,auVar48);
            } while (uVar30 != uVar29);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar67._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar67._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar67._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar67._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar67._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar67._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar67._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar67._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar67._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar67._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar67._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar67._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar67._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar67._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar67._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar67._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar67,1);
            auVar43 = vpmulld_avx512f(auVar67,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          local_208._0_4_ = rVar80;
          local_2d8.m_dst._0_4_ = (float)local_228._0_4_;
          local_208._12_4_ = (undefined4)uVar24;
          local_208._16_4_ = (undefined4)(uVar24 >> 0x20);
          local_2d8.m_src._4_4_ = SUB84(pfVar5,0);
          local_2d8.m_functor._0_4_ = (undefined4)((ulong)pfVar5 >> 0x20);
          if (uVar20 * iVar78 != uVar26) goto LAB_0022b425;
          uVar29 = uVar35;
          if (((uVar24 & 3) == 0) &&
             (uVar29 = (ulong)(-((uint)(uVar24 >> 2) & 0x3fffffff) & 0xf), uVar35 <= uVar29)) {
            uVar29 = uVar35;
          }
          auVar43 = vmovdqu64_avx512f(local_78);
          uVar30 = uVar35 - uVar29;
          uVar37 = uVar30 + 0xf;
          if (-1 < (long)uVar30) {
            uVar37 = uVar30;
          }
          fVar11 = 1.0 - rVar80;
          auVar43 = vpermt2d_avx512f(ZEXT3264(CONCAT1616(CONCAT412(local_228._0_4_,
                                                                   CONCAT48(local_228._0_4_,
                                                                            CONCAT44(local_228._0_4_
                                                                                     ,local_228.
                                                                                      _0_4_))),
                                                         ZEXT416((uint)fVar11))),auVar43,
                                     ZEXT864(pfVar5));
          auVar81 = valignd_avx512f(auVar43,auVar43,9);
          if (uVar29 != 0) {
            lVar31 = 0;
            do {
              auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * (float)local_2b0 *
                                                      *(float *)(auVar81._0_8_ + lVar31 * 4))),
                                        ZEXT416((uint)(rVar80 * *(float *)(uVar24 + lVar31 * 4))),
                                        ZEXT416((uint)pfVar5[lVar31]));
              *(int *)(uVar24 + lVar31 * 4) = auVar12._0_4_;
              lVar31 = lVar31 + 1;
            } while (uVar29 != lVar31);
          }
          lVar31 = uVar29 + (uVar37 & 0xfffffffffffffff0);
          if (0xf < (long)uVar30) {
            auVar47 = vpmovsxbd_avx512f(_DAT_0027dce0);
            auVar43 = vpermt2d_avx512f(auVar43,auVar47,ZEXT464(uVar26));
            auVar47 = vbroadcastss_avx512f(ZEXT416((uint)rVar80));
            auVar41 = vextracti32x4_avx512f(auVar43,2);
            lVar32 = vpextrq_avx(auVar41,1);
            auVar12 = vpshufd_avx(auVar43._16_16_,0xee);
            auVar43 = vbroadcastss_avx512f
                                (ZEXT416((uint)(auVar12._0_4_ * auVar43._0_4_ *
                                               (float)local_228._0_4_)));
            do {
              auVar48 = vmulps_avx512f(auVar47,*(undefined1 (*) [64])(uVar24 + uVar29 * 4));
              auVar49 = vmulps_avx512f(auVar43,*(undefined1 (*) [64])
                                                ((lVar32 << 0x20 | auVar41._0_8_ >> 0x20) +
                                                uVar29 * 4));
              auVar48 = vfmadd132ps_avx512f(auVar49,auVar48,*(undefined1 (*) [64])(pfVar5 + uVar29))
              ;
              *(undefined1 (*) [64])(uVar24 + uVar29 * 4) = auVar48;
              uVar29 = uVar29 + 0x10;
            } while ((long)uVar29 < lVar31);
          }
          if (lVar31 < (long)uVar35) {
            do {
              auVar12 = vfmadd132ss_fma(ZEXT416((uint)(fVar11 * (float)local_2b0 *
                                                      *(float *)(auVar81._0_8_ + lVar31 * 4))),
                                        ZEXT416((uint)(rVar80 * *(float *)(uVar24 + lVar31 * 4))),
                                        ZEXT416((uint)pfVar5[lVar31]));
              *(int *)(uVar24 + lVar31 * 4) = auVar12._0_4_;
              lVar31 = lVar31 + 1;
            } while (uVar35 != lVar31);
          }
          pfVar7 = *(float **)(lVar25 + 0x28);
          uVar24 = (ulong)*(uint *)(lVar25 + 0x1c);
          if (uVar24 == 0) {
            iVar78 = 1;
          }
          else {
            auVar43 = vmovdqa64_avx512f(auVar46);
            auVar81 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar29 * 4));
              auVar68._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar68._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar68._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar68._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar68._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar68._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar68._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar68._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar68._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar68._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar68._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar68._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar68._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar68._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar68._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar68._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar29 = uVar29 + 0x10;
              auVar43 = vpmulld_avx512f(auVar68,auVar48);
            } while ((uVar24 + 0xf & 0x1fffffff0) != uVar29);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar69._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar69._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar69._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar69._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar69._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar69._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar69._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar69._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar69._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar69._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar69._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar69._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar69._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar69._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar69._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar69._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar69,1);
            auVar43 = vpmulld_avx512f(auVar69,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          uVar20 = *(uint *)(lVar25 + 0x20);
          uVar29 = (ulong)(iVar78 * uVar20);
          local_2a0 = eVar33;
          local_268 = eVar9;
          local_260 = pPVar34;
          if (uVar26 - iVar78 * uVar20 != 0) goto LAB_0022b469;
          uVar37 = (ulong)*(uint *)(lVar36 + 0x1c + uVar23 * 0x48);
          if (uVar37 == 0) {
            iVar78 = 1;
          }
          else {
            auVar43 = vmovdqa64_avx512f(auVar46);
            auVar81 = vpbroadcastq_avx512f();
            uVar30 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                           (lVar36 + 8 + uVar23 * 0x48 + (uVar30 - 2) * 4));
              auVar70._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar70._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar70._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar70._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar70._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar70._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar70._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar70._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar70._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar70._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar70._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar70._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar70._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar70._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar70._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar70._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar30 = uVar30 + 0x10;
              auVar43 = vpmulld_avx512f(auVar70,auVar48);
            } while ((uVar37 + 0xf & 0x1fffffff0) != uVar30);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar71._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar71._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar71._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar71._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar71._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar71._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar71._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar71._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar71._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar71._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar71._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar71._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar71._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar71._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar71._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar71._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar71,1);
            auVar43 = vpmulld_avx512f(auVar71,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          uVar39 = iVar78 * *(int *)(lVar36 + 0x68 + (uVar23 - 1) * 0x48);
          pfVar38 = (float *)(ulong)uVar39;
          local_270 = p_Var28;
          if (uVar26 - uVar39 != 0) goto LAB_0022b4c5;
          sVar2.m_other = pAVar27->epsilon;
          pfVar8 = *(float **)(lVar36 + 0x70 + (uVar23 - 1) * 0x48);
          if (uVar24 == 0) {
            if (uVar20 != uVar26) goto LAB_0022b480;
            local_208._12_4_ = local_2e8->rho;
            uVar39 = uVar20;
LAB_0022b04b:
            iVar78 = 1;
          }
          else {
            auVar43 = vmovdqa64_avx512f(auVar46);
            uVar23 = uVar24 + 0xf & 0x1fffffff0;
            auVar81 = vpbroadcastq_avx512f();
            uVar37 = 0;
            do {
              auVar47 = vpbroadcastq_avx512f();
              auVar48 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar47,auVar45);
              auVar47 = vporq_avx512f(auVar47,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar47,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar37 * 4));
              auVar72._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar72._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar72._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar72._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar72._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar72._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar72._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar72._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar72._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar72._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar72._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar72._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar72._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar72._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar72._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar72._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar37 = uVar37 + 0x10;
              auVar43 = vpmulld_avx512f(auVar72,auVar48);
            } while (uVar23 != uVar37);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar73._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar48._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar73._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar48._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar73._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar48._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar73._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar48._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar73._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar48._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar73._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar48._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar73._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar48._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar73._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar48._28_4_;
            auVar73._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar48._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar73._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar48._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar73._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar48._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar73._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar48._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar73._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar48._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar73._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar48._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar73._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar48._56_4_;
            auVar73._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar48._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar73,1);
            auVar43 = vpmulld_avx512f(auVar73,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            uVar39 = auVar12._0_4_ * uVar20;
            if (uVar39 != uVar26) goto LAB_0022b480;
            local_208._12_4_ = local_2e8->rho;
            if (uVar24 == 0) goto LAB_0022b04b;
            uVar24 = 0;
            auVar43 = vmovdqa64_avx512f(auVar46);
            do {
              auVar46 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar46,auVar45);
              auVar46 = vporq_avx512f(auVar46,auVar44);
              uVar14 = vpcmpuq_avx512f(auVar46,auVar81,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar81,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar25 + uVar24 * 4));
              auVar74._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar74._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar74._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar74._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar74._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar74._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar74._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar74._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar74._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar74._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar74._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar74._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar74._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar74._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar74._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar74._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar24 = uVar24 + 0x10;
              auVar43 = vpmulld_avx512f(auVar74,auVar47);
            } while (uVar23 != uVar24);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar75._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar75._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar75._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar75._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar75._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar75._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar75._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar75._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar75._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar75._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar75._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar75._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar75._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar75._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar75._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar75._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar75,1);
            auVar43 = vpmulld_avx512f(auVar75,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          local_250 = (float *)(ulong)(uVar20 * iVar78);
          local_208._40_8_ = ZEXT48(uVar39);
          stack0xfffffffffffffe28 =
               (float *)CONCAT44(1.0 - (float)local_208._12_4_,local_208._48_4_);
          local_1a4.m_other = (float)local_228._0_4_;
          local_158.m_functor.m_other = sVar2.m_other;
          local_104.m_other = (float)local_228._0_4_;
          local_258 = pfVar7;
          local_208._24_8_ = pfVar7;
          local_198 = pfVar5;
          local_188.m_value = uVar35;
          local_170 = pfVar7;
          local_160.m_value = uVar29;
          local_140 = pfVar8;
          local_130.m_value = (long)pfVar38;
          local_128.m_other = sVar2.m_other;
          local_f8 = pfVar5;
          local_e8.m_value = uVar35;
          local_d0 = pfVar7;
          local_c0.m_value = uVar29;
          local_b8.m_other = sVar2.m_other;
          local_a0 = pfVar8;
          local_90.m_value = (long)pfVar38;
          local_88.m_other = sVar2.m_other;
          if (uVar20 * iVar78 != uVar26) goto LAB_0022b425;
          local_2d8.m_dst = &local_240;
          local_2d8.m_src = (SrcEvaluatorType *)local_208;
          local_2d8.m_functor = &local_2e9;
          local_2d8.m_dstExpr = (DstXprType *)&local_258;
          local_2e0 = sVar2.m_other;
          local_2dc = rVar1;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_data = pfVar7;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = (long)pfVar38;
          Eigen::internal::dense_assignment_loop<$6ae401cf$>::run(&local_2d8);
          if (uVar26 != (uint)local_260) goto LAB_0022b4ae;
          lVar36 = *(long *)(local_298._0_8_ + 0x30) + (long)local_2a0 * 8;
          if ((ulong)*(uint *)(lVar36 + 0x1c) == 0) {
            iVar78 = 1;
          }
          else {
            auVar43 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar46 = vpbroadcastq_avx512f();
            uVar23 = 0;
            do {
              auVar81 = vpbroadcastq_avx512f();
              auVar47 = vmovdqa64_avx512f(auVar43);
              auVar43 = vporq_avx512f(auVar81,auVar44);
              auVar81 = vporq_avx512f(auVar81,auVar45);
              uVar14 = vpcmpuq_avx512f(auVar81,auVar46,2);
              bVar15 = (byte)uVar14;
              uVar14 = vpcmpuq_avx512f(auVar43,auVar46,2);
              bVar16 = (byte)uVar14;
              uVar40 = CONCAT11(bVar16,bVar15);
              auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar36 + uVar23 * 4));
              auVar76._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_;
              auVar76._0_4_ = (uint)(bVar15 & 1) * auVar43._0_4_;
              auVar76._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_;
              auVar76._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_;
              auVar76._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_;
              auVar76._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_;
              auVar76._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_;
              auVar76._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * auVar43._28_4_;
              auVar76._32_4_ = (uint)(bVar16 & 1) * auVar43._32_4_;
              auVar76._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar43._36_4_;
              auVar76._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar43._40_4_;
              auVar76._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar43._44_4_;
              auVar76._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar43._48_4_;
              auVar76._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar43._52_4_;
              auVar76._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar43._56_4_;
              auVar76._60_4_ = (uint)(bVar16 >> 7) * auVar43._60_4_;
              uVar23 = uVar23 + 0x10;
              auVar43 = vpmulld_avx512f(auVar76,auVar47);
            } while (((ulong)*(uint *)(lVar36 + 0x1c) + 0xf & 0x1fffffff0) != uVar23);
            auVar43 = vmovdqa32_avx512f(auVar43);
            auVar77._0_4_ =
                 (uint)(bVar15 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar47._0_4_;
            bVar10 = (bool)((byte)(uVar40 >> 1) & 1);
            auVar77._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar47._4_4_;
            bVar10 = (bool)((byte)(uVar40 >> 2) & 1);
            auVar77._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar47._8_4_;
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            auVar77._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar47._12_4_;
            bVar10 = (bool)((byte)(uVar40 >> 4) & 1);
            auVar77._16_4_ = (uint)bVar10 * auVar43._16_4_ | (uint)!bVar10 * auVar47._16_4_;
            bVar10 = (bool)((byte)(uVar40 >> 5) & 1);
            auVar77._20_4_ = (uint)bVar10 * auVar43._20_4_ | (uint)!bVar10 * auVar47._20_4_;
            bVar10 = (bool)((byte)(uVar40 >> 6) & 1);
            auVar77._24_4_ = (uint)bVar10 * auVar43._24_4_ | (uint)!bVar10 * auVar47._24_4_;
            bVar10 = (bool)((byte)(uVar40 >> 7) & 1);
            auVar77._28_4_ = (uint)bVar10 * auVar43._28_4_ | (uint)!bVar10 * auVar47._28_4_;
            auVar77._32_4_ =
                 (uint)(bVar16 & 1) * auVar43._32_4_ | (uint)!(bool)(bVar16 & 1) * auVar47._32_4_;
            bVar10 = (bool)(bVar16 >> 1 & 1);
            auVar77._36_4_ = (uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * auVar47._36_4_;
            bVar10 = (bool)(bVar16 >> 2 & 1);
            auVar77._40_4_ = (uint)bVar10 * auVar43._40_4_ | (uint)!bVar10 * auVar47._40_4_;
            bVar10 = (bool)(bVar16 >> 3 & 1);
            auVar77._44_4_ = (uint)bVar10 * auVar43._44_4_ | (uint)!bVar10 * auVar47._44_4_;
            bVar10 = (bool)(bVar16 >> 4 & 1);
            auVar77._48_4_ = (uint)bVar10 * auVar43._48_4_ | (uint)!bVar10 * auVar47._48_4_;
            bVar10 = (bool)(bVar16 >> 5 & 1);
            auVar77._52_4_ = (uint)bVar10 * auVar43._52_4_ | (uint)!bVar10 * auVar47._52_4_;
            bVar10 = (bool)(bVar16 >> 6 & 1);
            auVar77._56_4_ = (uint)bVar10 * auVar43._56_4_ | (uint)!bVar10 * auVar47._56_4_;
            auVar77._60_4_ =
                 (uint)(bVar16 >> 7) * auVar43._60_4_ | (uint)!(bool)(bVar16 >> 7) * auVar47._60_4_;
            auVar42 = vextracti64x4_avx512f(auVar77,1);
            auVar43 = vpmulld_avx512f(auVar77,ZEXT3264(auVar42));
            auVar12 = vpmulld_avx(auVar43._0_16_,auVar43._16_16_);
            auVar41 = vpshufd_avx(auVar12,0xee);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            auVar41 = vpshufd_avx(auVar12,0x55);
            auVar12 = vpmulld_avx(auVar12,auVar41);
            iVar78 = auVar12._0_4_;
          }
          uVar20 = iVar78 * *(int *)(lVar36 + 0x20);
          local_250 = (float *)(ulong)uVar20;
          local_258 = *(float **)(*(long *)(local_298._0_8_ + 0x30) + 0x28 + (long)local_2a0 * 8);
          local_208._36_4_ = local_228._0_4_;
          local_198 = (float *)CONCAT44(local_198._4_4_,local_2e0);
          local_168 = local_2e0;
          local_158 = local_268;
          local_148 = local_260;
          local_140 = (float *)CONCAT44(local_140._4_4_,local_2dc);
          unique0x10002fd3 = pfVar5;
          local_1c8 = uVar35;
          local_1b0 = pfVar7;
          local_1a0 = uVar29;
          local_180 = pfVar8;
          local_170 = pfVar38;
          if (uVar20 != uVar26) goto LAB_0022b447;
          local_2d8.m_dst = &local_240;
          local_2d8.m_src = (SrcEvaluatorType *)local_208;
          local_2d8.m_functor = &local_2e9;
          local_2d8.m_dstExpr = (DstXprType *)&local_258;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_data = local_258;
          local_240.
          super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value = (long)local_250;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
                 *)&local_2d8);
          auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
          p_Var28 = local_270->_M_nxt;
          pAVar27 = local_2e8;
          pDVar18 = local_2d8.m_dst;
          paVar19 = local_2d8.m_functor;
        } while (p_Var28 != (_Hash_node_base *)0x0);
      }
      LookupParameters::clear((LookupParameters *)local_298._0_8_);
      auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar45 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
      local_2b8 = (ulong)((int)local_2b8 + 1);
      ppLVar22 = local_280 + 1;
    } while (ppLVar22 != local_210);
  }
  (pAVar27->super_Trainer).updates = (pAVar27->super_Trainer).updates + 1.0;
  return;
LAB_0022b497:
  local_2d8.m_functor = paVar19;
  local_2d8.m_dst = pDVar18;
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>>]"
  ;
  goto LAB_0022b4da;
LAB_0022b469:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_0022b4da;
LAB_0022b4c5:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::Cwi..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_0022b4da;
LAB_0022b480:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen..." /* TRUNCATED STRING LITERAL */
  ;
  goto LAB_0022b4da;
LAB_0022b4ae:
  __function = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::Ma..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0022b4da:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

void AdadeltaTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    hg = AllocateShadowParameters(*model);
    hlg = AllocateShadowLookupParameters(*model);
    hd = AllocateShadowParameters(*model);
    hld = AllocateShadowLookupParameters(*model);

    /*pi = 0;
    for (auto p : model->parameters_list()) {
      TensorTools::Constant(hg[pi].h, epsilon);
      TensorTools::Constant(hd[pi].h, epsilon);
      ++pi;
    }

    pi = 0;
    for (auto p : model->lookup_parameters_list()) {
      vector<Tensor>& hgx = hlg[pi].h;
      vector<Tensor>& hdx = hld[pi].h;
      for (unsigned i = 0; i < hgx.size(); ++i) {
        TensorTools::Constant(hgx[i], epsilon);
        TensorTools::Constant(hdx[i], epsilon);
      }
      ++pi;
    }*/

    shadow_params_allocated = true;
  }

  const float gscale = clip_gradients();
  pi = 0;
  for (auto p : model->parameters_list()) {
    auto& g = (scale * gscale) * p->g.vec();
    Tensor& hgv = hg[pi].h;
    Tensor& hdv = hd[pi].h;
    auto reg = p->values.vec() * lambda;
    auto g2 = g.cwiseProduct(g);
    hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
    auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
    auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
    auto delta = num.cwiseQuotient(den);
    auto d2 = delta.cwiseProduct(delta);
    hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
    p->values.vec() += delta - reg;
    p->clear();
    pi++;
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& hgvx = hlg[pi].h;
    vector<Tensor>& hdvx = hld[pi].h;
    for (auto i : p->non_zero_grads) {
      Tensor& hgv = hgvx[i];
      Tensor& hdv = hdvx[i];
      auto& g = scale * gscale * p->grads[i].vec();
      auto reg = p->values[i].vec() * lambda;
      auto g2 = g.cwiseProduct(g);
      hgv.vec() = rho * hgv.vec() + (1.0 - rho) * g2;
      auto num = -g.cwiseProduct((hdv.vec().array() + epsilon).matrix().cwiseSqrt());
      auto den = (hgv.vec().array() + epsilon).matrix().cwiseSqrt();
      auto delta = num.cwiseQuotient(den);
      auto d2 = delta.cwiseProduct(delta);
      hdv.vec() = rho * hdv.vec() + (1.0 - rho) * d2;
      p->values[i].vec() += delta - reg;
    }
    p->clear();
    pi++;
  }
  ++updates;
}